

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void soplex::MPSwriteRecord<double>
               (ostream *os,char *indicator,char *name,char *name1,double value1,char *name2,
               double value2)

{
  long in_RCX;
  char *in_RDX;
  char *in_RSI;
  ostream *in_RDI;
  long in_R8;
  char *in_XMM0_Qa;
  char *in_XMM1_Qa;
  char buf [81];
  char *local_b8;
  char *local_a8;
  char local_98 [96];
  char *local_38;
  long local_30;
  char *local_28;
  long local_20;
  ostream *local_8;
  
  local_a8 = in_RSI;
  if (in_RSI == (char *)0x0) {
    local_a8 = "";
  }
  local_b8 = in_RDX;
  if (in_RDX == (char *)0x0) {
    local_b8 = "";
  }
  local_38 = in_XMM1_Qa;
  local_30 = in_R8;
  local_28 = in_XMM0_Qa;
  local_20 = in_RCX;
  local_8 = in_RDI;
  spxSnprintf(local_98,0x51," %-2.2s %-8.8s",local_a8,local_b8);
  std::operator<<(local_8,local_98);
  if (local_20 != 0) {
    spxSnprintf(local_28,(size_t)local_98,(char *)0x51,"%-8.8s  %.15lf",local_20);
    std::operator<<(local_8,local_98);
    if (local_30 != 0) {
      spxSnprintf(local_38,(size_t)local_98,(char *)0x51,"   %-8.8s  %.15lf",local_30);
      std::operator<<(local_8,local_98);
    }
  }
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void MPSwriteRecord(
   std::ostream&  os,
   const char*    indicator,
   const char*    name,
   const char*    name1  = nullptr,
   const R     value1 = 0.0,
   const char*    name2  = nullptr,
   const R     value2 = 0.0
)
{
   char buf[81];

   spxSnprintf(buf, sizeof(buf), " %-2.2s %-8.8s", (indicator == nullptr) ? "" : indicator,
               (name == nullptr)      ? "" : name);
   os << buf;

   if(name1 != nullptr)
   {
      spxSnprintf(buf, sizeof(buf), "%-8.8s  %.15" SOPLEX_REAL_FORMAT, name1, (Real) value1);
      os << buf;

      if(name2 != nullptr)
      {
         spxSnprintf(buf, sizeof(buf), "   %-8.8s  %.15" SOPLEX_REAL_FORMAT, name2, (Real) value2);
         os << buf;
      }
   }

   os << std::endl;
}